

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O2

void __thiscall
Assimp::STEP::InternGenericConvert<long>::operator()
          (InternGenericConvert<long> *this,long *out,
          shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *in,DB *param_3)

{
  long lVar1;
  
  lVar1 = __dynamic_cast((in->
                         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr,&EXPRESS::DataType::typeinfo,
                         &EXPRESS::PrimitiveDataType<long>::typeinfo,0);
  if (lVar1 != 0) {
    *out = *(long *)(lVar1 + 8);
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void operator()(T& out, const std::shared_ptr< const EXPRESS::DataType >& in, const STEP::DB& /*db*/) {
            try{
                out = dynamic_cast< const typename PickBaseType<T>::Type& > ( *in );
            } catch(std::bad_cast&) {
                throw TypeError("type error reading literal field");
            }
        }